

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkSetRefs(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  ulong uVar9;
  
  uVar3 = p->iObj;
  if ((p->vRefs).nCap < (int)uVar3) {
    piVar5 = (p->vRefs).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar3 << 2);
    }
    (p->vRefs).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p->vRefs).pArray,0,(ulong)uVar3 * 4);
  }
  (p->vRefs).nSize = uVar3;
  if (1 < p->iObj) {
    lVar6 = 1;
    do {
      if (p->nObjsAlloc <= lVar6) goto LAB_0036fa26;
      uVar3 = p->pObjs[lVar6].nFanins;
      uVar9 = (ulong)uVar3;
      if (0 < (int)uVar3) {
        pWVar1 = p->pObjs + lVar6;
        lVar7 = 0;
        do {
          if ((2 < (uint)uVar9) ||
             (paVar8 = &pWVar1->field_10,
             (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
          }
          iVar4 = paVar8->Fanins[lVar7];
          if (((long)iVar4 < 0) || ((p->vRefs).nSize <= iVar4)) goto LAB_0036fa07;
          piVar5 = (p->vRefs).pArray + iVar4;
          *piVar5 = *piVar5 + 1;
          lVar7 = lVar7 + 1;
          uVar9 = (ulong)(int)pWVar1->nFanins;
        } while (lVar7 < (long)uVar9);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->iObj);
  }
  if (0 < (p->vCos).nSize) {
    piVar5 = (p->vCos).pArray;
    lVar6 = 0;
    do {
      iVar4 = piVar5[lVar6];
      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) {
LAB_0036fa26:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vRefs).nSize <= iVar4) {
LAB_0036fa07:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar2 = (p->vRefs).pArray + iVar4;
      *piVar2 = *piVar2 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vCos).nSize);
  }
  return;
}

Assistant:

void Wlc_NtkSetRefs( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; int i, k, Fanin;
    Vec_IntFill( &p->vRefs, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_ObjForEachFanin( pObj, Fanin, k )
            Vec_IntAddToEntry( &p->vRefs, Fanin, 1 );
    Wlc_NtkForEachCo( p, pObj, i )
        Vec_IntAddToEntry( &p->vRefs, Wlc_ObjId(p, pObj), 1 );
}